

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  byte bVar31;
  undefined1 (*pauVar32) [32];
  ulong uVar33;
  byte bVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 uVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  uint uVar81;
  uint uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  long lStack_2600;
  byte local_25f0;
  int local_25bc;
  ulong local_25b8;
  StackItemT<embree::NodeRefPtr<8>_> *local_25b0;
  RayQueryContext *local_25a8;
  long local_25a0;
  long local_2598;
  Scene *local_2590;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2528;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25b0 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar77 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx512vl((undefined1  [16])aVar2,auVar40);
    auVar76._8_4_ = 0x219392ef;
    auVar76._0_8_ = 0x219392ef219392ef;
    auVar76._12_4_ = 0x219392ef;
    uVar18 = vcmpps_avx512vl(auVar40,auVar76,1);
    bVar38 = (bool)((byte)uVar18 & 1);
    auVar41._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * (int)aVar2.x;
    bVar38 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar41._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * (int)aVar2.y;
    bVar38 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar41._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * (int)aVar2.z;
    bVar38 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar41._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * aVar2.field_3.a;
    auVar40 = vrcp14ps_avx512vl(auVar41);
    auVar42._8_4_ = 0x3f800000;
    auVar42._0_8_ = 0x3f8000003f800000;
    auVar42._12_4_ = 0x3f800000;
    auVar42 = vfnmadd213ps_avx512vl(auVar41,auVar40,auVar42);
    auVar41 = vfmadd132ps_fma(auVar42,auVar40,auVar40);
    auVar54 = vbroadcastss_avx512vl(auVar41);
    auVar87 = ZEXT3264(auVar54);
    auVar40 = vmovshdup_avx(auVar41);
    auVar54 = vbroadcastsd_avx512vl(auVar40);
    auVar88 = ZEXT3264(auVar54);
    auVar58._8_4_ = 2;
    auVar58._0_8_ = 0x200000002;
    auVar58._12_4_ = 2;
    auVar58._16_4_ = 2;
    auVar58._20_4_ = 2;
    auVar58._24_4_ = 2;
    auVar58._28_4_ = 2;
    auVar42 = vshufpd_avx(auVar41,auVar41,1);
    auVar54 = vpermps_avx512vl(auVar58,ZEXT1632(auVar41));
    auVar89 = ZEXT3264(auVar54);
    fVar65 = auVar41._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar54 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar90 = ZEXT3264(auVar54);
    auVar59._4_4_ = fVar65;
    auVar59._0_4_ = fVar65;
    auVar59._8_4_ = fVar65;
    auVar59._12_4_ = fVar65;
    auVar59._16_4_ = fVar65;
    auVar59._20_4_ = fVar65;
    auVar59._24_4_ = fVar65;
    auVar59._28_4_ = fVar65;
    auVar56 = ZEXT1632(CONCAT412(auVar41._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar41._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar41._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar65))
                                ));
    auVar55 = vpermps_avx512vl(auVar54,auVar56);
    auVar54 = vpermps_avx2(auVar58,auVar56);
    local_25b8 = (ulong)(auVar41._0_4_ < 0.0) << 3;
    uVar18 = (ulong)(auVar40._0_4_ < 0.0) * 8 + 0x10;
    lVar1 = (ulong)(auVar42._0_4_ < 0.0) * 8;
    uVar71 = auVar77._0_4_;
    auVar68 = ZEXT3264(CONCAT428(uVar71,CONCAT424(uVar71,CONCAT420(uVar71,CONCAT416(uVar71,CONCAT412
                                                  (uVar71,CONCAT48(uVar71,CONCAT44(uVar71,uVar71))))
                                                  ))));
    uVar37 = local_25b8 ^ 8;
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar57._16_4_ = 0x80000000;
    auVar57._20_4_ = 0x80000000;
    auVar57._24_4_ = 0x80000000;
    auVar57._28_4_ = 0x80000000;
    auVar56 = vxorps_avx512vl(auVar59,auVar57);
    auVar91 = ZEXT3264(auVar56);
    auVar55 = vxorps_avx512vl(auVar55,auVar57);
    auVar92 = ZEXT3264(auVar55);
    auVar54 = vxorps_avx512vl(auVar54,auVar57);
    auVar93 = ZEXT3264(auVar54);
    auVar54 = vbroadcastss_avx512vl(auVar43);
    auVar94 = ZEXT3264(auVar54);
    auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar95 = ZEXT3264(auVar54);
    auVar54 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar96 = ZEXT3264(auVar54);
    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar97 = ZEXT1664(auVar43);
    auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar98 = ZEXT3264(auVar54);
    auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar99 = ZEXT3264(auVar54);
    local_25a8 = context;
LAB_01c7657a:
    if (local_25b0 != stack) {
      pSVar28 = local_25b0 + -1;
      local_25b0 = local_25b0 + -1;
      if ((float)pSVar28->dist <= (ray->super_RayK<1>).tfar) {
        uVar33 = (local_25b0->ptr).ptr;
LAB_01c76597:
        do {
          if ((uVar33 & 8) != 0) goto LAB_01c76947;
          pauVar32 = (undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0);
          pauVar29 = pauVar32 + 2;
          if (pauVar32 == (undefined1 (*) [32])0x0) {
            pauVar29 = (undefined1 (*) [32])0x0;
          }
          auVar69._8_8_ = 0;
          auVar69._0_8_ = *(ulong *)*pauVar29;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(*pauVar29 + 8);
          uVar33 = vpcmpub_avx512vl(auVar69,auVar70,2);
          uVar71 = *(undefined4 *)(pauVar29[1] + 0x10);
          auVar55._4_4_ = uVar71;
          auVar55._0_4_ = uVar71;
          auVar55._8_4_ = uVar71;
          auVar55._12_4_ = uVar71;
          auVar55._16_4_ = uVar71;
          auVar55._20_4_ = uVar71;
          auVar55._24_4_ = uVar71;
          auVar55._28_4_ = uVar71;
          uVar71 = *(undefined4 *)(pauVar29[1] + 0x1c);
          auVar63._4_4_ = uVar71;
          auVar63._0_4_ = uVar71;
          auVar63._8_4_ = uVar71;
          auVar63._12_4_ = uVar71;
          auVar63._16_4_ = uVar71;
          auVar63._20_4_ = uVar71;
          auVar63._24_4_ = uVar71;
          auVar63._28_4_ = uVar71;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(*pauVar29 + local_25b8);
          auVar54 = vpmovzxbd_avx2(auVar5);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar43 = vfmadd213ps_fma(auVar54,auVar63,auVar55);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(*pauVar29 + uVar37);
          auVar54 = vpmovzxbd_avx2(auVar6);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar77 = vfmadd213ps_fma(auVar54,auVar63,auVar55);
          uVar71 = *(undefined4 *)(pauVar29[1] + 0x14);
          auVar56._4_4_ = uVar71;
          auVar56._0_4_ = uVar71;
          auVar56._8_4_ = uVar71;
          auVar56._12_4_ = uVar71;
          auVar56._16_4_ = uVar71;
          auVar56._20_4_ = uVar71;
          auVar56._24_4_ = uVar71;
          auVar56._28_4_ = uVar71;
          uVar71 = *(undefined4 *)pauVar29[2];
          auVar61._4_4_ = uVar71;
          auVar61._0_4_ = uVar71;
          auVar61._8_4_ = uVar71;
          auVar61._12_4_ = uVar71;
          auVar61._16_4_ = uVar71;
          auVar61._20_4_ = uVar71;
          auVar61._24_4_ = uVar71;
          auVar61._28_4_ = uVar71;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(*pauVar29 + uVar18);
          auVar54 = vpmovzxbd_avx2(auVar7);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar40 = vfmadd213ps_fma(auVar54,auVar61,auVar56);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(*pauVar29 + (uVar18 ^ 8));
          auVar54 = vpmovzxbd_avx2(auVar8);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar42 = vfmadd213ps_fma(auVar54,auVar61,auVar56);
          uVar71 = *(undefined4 *)(pauVar29[1] + 0x18);
          auVar64._4_4_ = uVar71;
          auVar64._0_4_ = uVar71;
          auVar64._8_4_ = uVar71;
          auVar64._12_4_ = uVar71;
          auVar64._16_4_ = uVar71;
          auVar64._20_4_ = uVar71;
          auVar64._24_4_ = uVar71;
          auVar64._28_4_ = uVar71;
          uVar71 = *(undefined4 *)(pauVar29[2] + 4);
          auVar62._4_4_ = uVar71;
          auVar62._0_4_ = uVar71;
          auVar62._8_4_ = uVar71;
          auVar62._12_4_ = uVar71;
          auVar62._16_4_ = uVar71;
          auVar62._20_4_ = uVar71;
          auVar62._24_4_ = uVar71;
          auVar62._28_4_ = uVar71;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(pauVar29[1] + lVar1);
          auVar54 = vpmovzxbd_avx2(auVar9);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar41 = vfmadd213ps_fma(auVar54,auVar62,auVar64);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(*pauVar29 + (lVar1 + 0x20U ^ 8));
          auVar54 = vpmovzxbd_avx2(auVar10);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar76 = vfmadd213ps_fma(auVar54,auVar62,auVar64);
          auVar54 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar87._0_32_,auVar91._0_32_);
          auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar40),auVar88._0_32_,auVar92._0_32_);
          auVar54 = vpmaxsd_avx2(auVar54,auVar55);
          auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar89._0_32_,auVar93._0_32_);
          auVar55 = vpmaxsd_avx512vl(auVar55,auVar94._0_32_);
          auVar54 = vpmaxsd_avx2(auVar54,auVar55);
          auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar77),auVar87._0_32_,auVar91._0_32_);
          auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar88._0_32_,auVar92._0_32_);
          auVar55 = vpminsd_avx2(auVar55,auVar56);
          auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar76),auVar89._0_32_,auVar93._0_32_);
          auVar56 = vpminsd_avx2(auVar56,auVar68._0_32_);
          auVar55 = vpminsd_avx2(auVar55,auVar56);
          uVar39 = vpcmpd_avx512vl(auVar54,auVar55,2);
          uVar39 = uVar33 & 0xff & uVar39;
          bVar34 = (byte)uVar39;
          if (bVar34 == 0) break;
          auVar55 = *pauVar32;
          auVar56 = pauVar32[1];
          auVar57 = vmovdqa64_avx512vl(auVar95._0_32_);
          auVar57 = vpternlogd_avx512vl(auVar57,auVar54,auVar96._0_32_,0xf8);
          auVar58 = vpcompressd_avx512vl(auVar57);
          auVar60._0_4_ =
               (uint)(bVar34 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar57._0_4_;
          bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar38 * auVar58._4_4_ | (uint)!bVar38 * auVar57._4_4_;
          bVar38 = (bool)((byte)(uVar39 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar38 * auVar58._8_4_ | (uint)!bVar38 * auVar57._8_4_;
          bVar38 = (bool)((byte)(uVar39 >> 3) & 1);
          auVar60._12_4_ = (uint)bVar38 * auVar58._12_4_ | (uint)!bVar38 * auVar57._12_4_;
          bVar38 = (bool)((byte)(uVar39 >> 4) & 1);
          auVar60._16_4_ = (uint)bVar38 * auVar58._16_4_ | (uint)!bVar38 * auVar57._16_4_;
          bVar38 = (bool)((byte)(uVar39 >> 5) & 1);
          auVar60._20_4_ = (uint)bVar38 * auVar58._20_4_ | (uint)!bVar38 * auVar57._20_4_;
          bVar38 = (bool)((byte)(uVar39 >> 6) & 1);
          auVar60._24_4_ = (uint)bVar38 * auVar58._24_4_ | (uint)!bVar38 * auVar57._24_4_;
          bVar38 = SUB81(uVar39 >> 7,0);
          auVar60._28_4_ = (uint)bVar38 * auVar58._28_4_ | (uint)!bVar38 * auVar57._28_4_;
          auVar57 = vpermt2q_avx512vl(auVar55,auVar60,auVar56);
          uVar33 = auVar57._0_8_;
          bVar34 = bVar34 - 1 & bVar34;
          if (bVar34 != 0) {
            auVar57 = vpshufd_avx2(auVar60,0x55);
            vpermt2q_avx512vl(auVar55,auVar57,auVar56);
            auVar58 = vpminsd_avx2(auVar60,auVar57);
            auVar57 = vpmaxsd_avx2(auVar60,auVar57);
            bVar34 = bVar34 - 1 & bVar34;
            if (bVar34 == 0) {
              auVar58 = vpermi2q_avx512vl(auVar58,auVar55,auVar56);
              uVar33 = auVar58._0_8_;
              auVar55 = vpermt2q_avx512vl(auVar55,auVar57,auVar56);
              (local_25b0->ptr).ptr = auVar55._0_8_;
              lVar30 = 8;
              lStack_2600 = 0x10;
            }
            else {
              auVar64 = vpshufd_avx2(auVar60,0xaa);
              vpermt2q_avx512vl(auVar55,auVar64,auVar56);
              auVar59 = vpminsd_avx2(auVar58,auVar64);
              auVar58 = vpmaxsd_avx2(auVar58,auVar64);
              auVar64 = vpminsd_avx2(auVar57,auVar58);
              auVar58 = vpmaxsd_avx2(auVar57,auVar58);
              bVar34 = bVar34 - 1 & bVar34;
              if (bVar34 == 0) {
                auVar57 = vpermi2q_avx512vl(auVar59,auVar55,auVar56);
                uVar33 = auVar57._0_8_;
                auVar57 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                (local_25b0->ptr).ptr = auVar57._0_8_;
                auVar57 = vpermd_avx2(auVar58,auVar54);
                local_25b0->dist = auVar57._0_4_;
                auVar55 = vpermt2q_avx512vl(auVar55,auVar64,auVar56);
                local_25b0[1].ptr.ptr = auVar55._0_8_;
                lVar30 = 0x18;
                lStack_2600 = 0x20;
                auVar57 = auVar64;
              }
              else {
                auVar57 = vpshufd_avx2(auVar60,0xff);
                vpermt2q_avx512vl(auVar55,auVar57,auVar56);
                auVar63 = vpminsd_avx2(auVar59,auVar57);
                auVar59 = vpmaxsd_avx2(auVar59,auVar57);
                auVar57 = vpminsd_avx2(auVar64,auVar59);
                auVar59 = vpmaxsd_avx2(auVar64,auVar59);
                auVar64 = vpminsd_avx2(auVar58,auVar59);
                auVar58 = vpmaxsd_avx2(auVar58,auVar59);
                bVar34 = bVar34 - 1 & bVar34;
                if (bVar34 != 0) {
                  auVar60 = valignd_avx512vl(auVar60,auVar60,3);
                  auVar59 = vmovdqa64_avx512vl(auVar97._0_32_);
                  auVar61 = vmovdqa64_avx512vl(auVar97._0_32_);
                  auVar62 = vmovdqa64_avx512vl(auVar98._0_32_);
                  auVar63 = vpermt2d_avx512vl(auVar61,auVar98._0_32_,auVar63);
                  auVar61 = auVar99._0_32_;
                  auVar57 = vpermt2d_avx512vl(auVar63,auVar61,auVar57);
                  auVar63 = vmovdqa64_avx512vl(auVar61);
                  auVar64 = vpermt2d_avx512vl(auVar57,auVar61,auVar64);
                  auVar57 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar57 = vpermt2d_avx512vl(auVar64,auVar57,auVar58);
                  auVar97 = ZEXT3264(auVar57);
                  bVar31 = bVar34;
                  do {
                    auVar58 = auVar97._0_32_;
                    auVar57 = vpermps_avx512vl(auVar90._0_32_,auVar60);
                    auVar60 = valignd_avx512vl(auVar60,auVar60,1);
                    vpermt2q_avx512vl(auVar55,auVar60,auVar56);
                    bVar31 = bVar31 - 1 & bVar31;
                    uVar22 = vpcmpd_avx512vl(auVar57,auVar58,5);
                    auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                    bVar23 = (byte)uVar22 << 1;
                    auVar58 = valignd_avx512vl(auVar58,auVar58,7);
                    bVar38 = (bool)((byte)uVar22 & 1);
                    bVar13 = (bool)(bVar23 >> 2 & 1);
                    bVar14 = (bool)(bVar23 >> 3 & 1);
                    bVar15 = (bool)(bVar23 >> 4 & 1);
                    bVar16 = (bool)(bVar23 >> 5 & 1);
                    bVar17 = (bool)(bVar23 >> 6 & 1);
                    auVar97 = ZEXT3264(CONCAT428((uint)(bVar23 >> 7) * auVar58._28_4_ |
                                                 (uint)!(bool)(bVar23 >> 7) * auVar57._28_4_,
                                                 CONCAT424((uint)bVar17 * auVar58._24_4_ |
                                                           (uint)!bVar17 * auVar57._24_4_,
                                                           CONCAT420((uint)bVar16 * auVar58._20_4_ |
                                                                     (uint)!bVar16 * auVar57._20_4_,
                                                                     CONCAT416((uint)bVar15 *
                                                                               auVar58._16_4_ |
                                                                               (uint)!bVar15 *
                                                                               auVar57._16_4_,
                                                                               CONCAT412((uint)
                                                  bVar14 * auVar58._12_4_ |
                                                  (uint)!bVar14 * auVar57._12_4_,
                                                  CONCAT48((uint)bVar13 * auVar58._8_4_ |
                                                           (uint)!bVar13 * auVar57._8_4_,
                                                           CONCAT44((uint)bVar38 * auVar58._4_4_ |
                                                                    (uint)!bVar38 * auVar57._4_4_,
                                                                    auVar57._0_4_))))))));
                  } while (bVar31 != 0);
                  lVar30 = (ulong)(uint)POPCOUNT((uint)bVar34) + 3;
                  while( true ) {
                    auVar58 = auVar97._0_32_;
                    auVar57 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                    uVar33 = auVar57._0_8_;
                    bVar38 = lVar30 == 0;
                    lVar30 = lVar30 + -1;
                    if (bVar38) break;
                    (local_25b0->ptr).ptr = uVar33;
                    auVar57 = vpermd_avx2(auVar58,auVar54);
                    local_25b0->dist = auVar57._0_4_;
                    auVar57 = valignd_avx512vl(auVar58,auVar58,1);
                    auVar97 = ZEXT3264(auVar57);
                    local_25b0 = local_25b0 + 1;
                  }
                  auVar54 = vmovdqa64_avx512vl(auVar59);
                  auVar97 = ZEXT3264(auVar54);
                  auVar54 = vmovdqa64_avx512vl(auVar62);
                  auVar98 = ZEXT3264(auVar54);
                  auVar54 = vmovdqa64_avx512vl(auVar63);
                  auVar99 = ZEXT3264(auVar54);
                  goto LAB_01c76597;
                }
                auVar59 = vpermi2q_avx512vl(auVar63,auVar55,auVar56);
                uVar33 = auVar59._0_8_;
                auVar59 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                (local_25b0->ptr).ptr = auVar59._0_8_;
                auVar58 = vpermd_avx2(auVar58,auVar54);
                local_25b0->dist = auVar58._0_4_;
                auVar58 = vpermt2q_avx512vl(auVar55,auVar64,auVar56);
                local_25b0[1].ptr.ptr = auVar58._0_8_;
                auVar58 = vpermd_avx2(auVar64,auVar54);
                local_25b0[1].dist = auVar58._0_4_;
                auVar55 = vpermt2q_avx512vl(auVar55,auVar57,auVar56);
                local_25b0[2].ptr.ptr = auVar55._0_8_;
                lStack_2600 = 0x28;
                lVar30 = lStack_2600;
                lStack_2600 = 0x30;
              }
            }
            auVar54 = vpermd_avx2(auVar57,auVar54);
            *(int *)((long)&(local_25b0->ptr).ptr + lVar30) = auVar54._0_4_;
            local_25b0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25b0->ptr).ptr + lStack_2600);
          }
        } while( true );
      }
      goto LAB_01c7657a;
    }
  }
  return;
LAB_01c76947:
  local_2598 = (ulong)((uint)uVar33 & 0xf) - 8;
  uVar33 = uVar33 & 0xfffffffffffffff0;
  for (local_25a0 = 0; local_25a0 != local_2598; local_25a0 = local_25a0 + 1) {
    lVar30 = local_25a0 * 0xb0;
    auVar43 = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar30);
    auVar77 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar30);
    auVar40 = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar30);
    auVar42 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar30);
    auVar44._0_4_ = auVar77._0_4_ * auVar43._0_4_;
    auVar44._4_4_ = auVar77._4_4_ * auVar43._4_4_;
    auVar44._8_4_ = auVar77._8_4_ * auVar43._8_4_;
    auVar44._12_4_ = auVar77._12_4_ * auVar43._12_4_;
    auVar41 = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar30);
    auVar76 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar30);
    local_2488 = vfmsub231ps_fma(auVar44,auVar40,auVar42);
    auVar48._0_4_ = auVar42._0_4_ * auVar41._0_4_;
    auVar48._4_4_ = auVar42._4_4_ * auVar41._4_4_;
    auVar48._8_4_ = auVar42._8_4_ * auVar41._8_4_;
    auVar48._12_4_ = auVar42._12_4_ * auVar41._12_4_;
    local_2478 = vfmsub231ps_fma(auVar48,auVar43,auVar76);
    auVar49._0_4_ = auVar76._0_4_ * auVar40._0_4_;
    auVar49._4_4_ = auVar76._4_4_ * auVar40._4_4_;
    auVar49._8_4_ = auVar76._8_4_ * auVar40._8_4_;
    auVar49._12_4_ = auVar76._12_4_ * auVar40._12_4_;
    uVar71 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar83._4_4_ = uVar71;
    auVar83._0_4_ = uVar71;
    auVar83._8_4_ = uVar71;
    auVar83._12_4_ = uVar71;
    uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar84._4_4_ = uVar71;
    auVar84._0_4_ = uVar71;
    auVar84._8_4_ = uVar71;
    auVar84._12_4_ = uVar71;
    fVar65 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar85._4_4_ = fVar65;
    auVar85._0_4_ = fVar65;
    auVar85._8_4_ = fVar65;
    auVar85._12_4_ = fVar65;
    uVar71 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar47._4_4_ = uVar71;
    auVar47._0_4_ = uVar71;
    auVar47._8_4_ = uVar71;
    auVar47._12_4_ = uVar71;
    auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + lVar30),auVar47);
    local_2468 = vfmsub231ps_fma(auVar49,auVar41,auVar77);
    uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar45._4_4_ = uVar71;
    auVar45._0_4_ = uVar71;
    auVar45._8_4_ = uVar71;
    auVar45._12_4_ = uVar71;
    auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x10 + lVar30),auVar45);
    uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar46._4_4_ = uVar71;
    auVar46._0_4_ = uVar71;
    auVar46._8_4_ = uVar71;
    auVar46._12_4_ = uVar71;
    auVar46 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + lVar30),auVar46);
    auVar47 = vmulps_avx512vl(auVar84,auVar46);
    auVar48 = vfmsub231ps_avx512vl(auVar47,auVar45,auVar85);
    auVar47 = vmulps_avx512vl(auVar85,auVar44);
    auVar49 = vfmsub231ps_avx512vl(auVar47,auVar46,auVar83);
    auVar47 = vmulps_avx512vl(auVar83,auVar45);
    auVar50 = vfmsub231ps_avx512vl(auVar47,auVar44,auVar84);
    auVar86._0_4_ = fVar65 * local_2468._0_4_;
    auVar86._4_4_ = fVar65 * local_2468._4_4_;
    auVar86._8_4_ = fVar65 * local_2468._8_4_;
    auVar86._12_4_ = fVar65 * local_2468._12_4_;
    auVar47 = vfmadd231ps_fma(auVar86,local_2478,auVar84);
    auVar47 = vfmadd231ps_fma(auVar47,local_2488,auVar83);
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar51 = vandps_avx512vl(auVar47,auVar51);
    auVar43 = vmulps_avx512vl(auVar43,auVar50);
    auVar43 = vfmadd231ps_avx512vl(auVar43,auVar49,auVar40);
    auVar40 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar41);
    auVar43._8_4_ = 0x80000000;
    auVar43._0_8_ = 0x8000000080000000;
    auVar43._12_4_ = 0x80000000;
    auVar43 = vandpd_avx512vl(auVar47,auVar43);
    uVar81 = auVar43._0_4_;
    auVar75._0_4_ = (float)(uVar81 ^ auVar40._0_4_);
    uVar35 = auVar43._4_4_;
    auVar75._4_4_ = (float)(uVar35 ^ auVar40._4_4_);
    uVar82 = auVar43._8_4_;
    auVar75._8_4_ = (float)(uVar82 ^ auVar40._8_4_);
    uVar36 = auVar43._12_4_;
    auVar75._12_4_ = (float)(uVar36 ^ auVar40._12_4_);
    auVar43 = vmulps_avx512vl(auVar42,auVar50);
    auVar43 = vfmadd231ps_avx512vl(auVar43,auVar77,auVar49);
    auVar43 = vfmadd231ps_avx512vl(auVar43,auVar76,auVar48);
    auVar77._0_4_ = (float)(uVar81 ^ auVar43._0_4_);
    auVar77._4_4_ = (float)(uVar35 ^ auVar43._4_4_);
    auVar77._8_4_ = (float)(uVar82 ^ auVar43._8_4_);
    auVar77._12_4_ = (float)(uVar36 ^ auVar43._12_4_);
    auVar43 = ZEXT816(0) << 0x20;
    uVar22 = vcmpps_avx512vl(auVar75,auVar43,5);
    uVar19 = vcmpps_avx512vl(auVar77,auVar43,5);
    uVar20 = vcmpps_avx512vl(auVar47,auVar43,4);
    auVar50._0_4_ = auVar75._0_4_ + auVar77._0_4_;
    auVar50._4_4_ = auVar75._4_4_ + auVar77._4_4_;
    auVar50._8_4_ = auVar75._8_4_ + auVar77._8_4_;
    auVar50._12_4_ = auVar75._12_4_ + auVar77._12_4_;
    uVar21 = vcmpps_avx512vl(auVar50,auVar51,2);
    bVar34 = (byte)uVar22 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
    if (bVar34 != 0) {
      auVar80._0_4_ = auVar46._0_4_ * local_2468._0_4_;
      auVar80._4_4_ = auVar46._4_4_ * local_2468._4_4_;
      auVar80._8_4_ = auVar46._8_4_ * local_2468._8_4_;
      auVar80._12_4_ = auVar46._12_4_ * local_2468._12_4_;
      auVar43 = vfmadd213ps_fma(auVar45,local_2478,auVar80);
      auVar43 = vfmadd213ps_fma(auVar44,local_2488,auVar43);
      auVar78._0_4_ = (float)(uVar81 ^ auVar43._0_4_);
      auVar78._4_4_ = (float)(uVar35 ^ auVar43._4_4_);
      auVar78._8_4_ = (float)(uVar82 ^ auVar43._8_4_);
      auVar78._12_4_ = (float)(uVar36 ^ auVar43._12_4_);
      uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar24._4_4_ = uVar71;
      auVar24._0_4_ = uVar71;
      auVar24._8_4_ = uVar71;
      auVar24._12_4_ = uVar71;
      auVar43 = vmulps_avx512vl(auVar51,auVar24);
      fVar65 = (ray->super_RayK<1>).tfar;
      auVar25._4_4_ = fVar65;
      auVar25._0_4_ = fVar65;
      auVar25._8_4_ = fVar65;
      auVar25._12_4_ = fVar65;
      auVar40 = vmulps_avx512vl(auVar51,auVar25);
      uVar22 = vcmpps_avx512vl(auVar78,auVar40,2);
      uVar19 = vcmpps_avx512vl(auVar43,auVar78,1);
      bVar34 = (byte)uVar22 & (byte)uVar19 & bVar34;
      if (bVar34 != 0) {
        lVar30 = lVar30 + uVar33;
        auVar3._0_4_ = (ray->super_RayK<1>).tfar;
        auVar3._4_4_ = (ray->super_RayK<1>).mask;
        auVar3._8_4_ = (ray->super_RayK<1>).id;
        auVar3._12_4_ = (ray->super_RayK<1>).flags;
        auVar79 = ZEXT1664(auVar3);
        uVar81 = vextractps_avx(auVar3,1);
        auVar43 = vrcp14ps_avx512vl(auVar51);
        auVar26._8_4_ = 0x3f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._12_4_ = 0x3f800000;
        auVar40 = vfnmadd213ps_avx512vl(auVar51,auVar43,auVar26);
        auVar43 = vfmadd132ps_fma(auVar40,auVar43,auVar43);
        fVar65 = auVar43._0_4_;
        local_2498._0_4_ = fVar65 * auVar78._0_4_;
        fVar72 = auVar43._4_4_;
        local_2498._4_4_ = fVar72 * auVar78._4_4_;
        fVar73 = auVar43._8_4_;
        local_2498._8_4_ = fVar73 * auVar78._8_4_;
        fVar74 = auVar43._12_4_;
        local_2498._12_4_ = fVar74 * auVar78._12_4_;
        auVar68 = ZEXT1664(local_2498);
        local_24b8[0] = fVar65 * auVar75._0_4_;
        local_24b8[1] = fVar72 * auVar75._4_4_;
        local_24b8[2] = fVar73 * auVar75._8_4_;
        local_24b8[3] = fVar74 * auVar75._12_4_;
        local_24a8[0] = fVar65 * auVar77._0_4_;
        local_24a8[1] = fVar72 * auVar77._4_4_;
        local_24a8[2] = fVar73 * auVar77._8_4_;
        local_24a8[3] = fVar74 * auVar77._12_4_;
        auVar66._8_4_ = 0x7f800000;
        auVar66._0_8_ = 0x7f8000007f800000;
        auVar66._12_4_ = 0x7f800000;
        auVar43 = vblendmps_avx512vl(auVar66,local_2498);
        auVar52._0_4_ = (uint)(bVar34 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000;
        bVar38 = (bool)(bVar34 >> 1 & 1);
        auVar52._4_4_ = (uint)bVar38 * auVar43._4_4_ | (uint)!bVar38 * 0x7f800000;
        bVar38 = (bool)(bVar34 >> 2 & 1);
        auVar52._8_4_ = (uint)bVar38 * auVar43._8_4_ | (uint)!bVar38 * 0x7f800000;
        bVar38 = (bool)(bVar34 >> 3 & 1);
        auVar52._12_4_ = (uint)bVar38 * auVar43._12_4_ | (uint)!bVar38 * 0x7f800000;
        auVar43 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar43 = vminps_avx(auVar43,auVar52);
        auVar77 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar77,auVar43);
        uVar22 = vcmpps_avx512vl(auVar52,auVar43,0);
        uVar35 = (uint)bVar34;
        if (((byte)uVar22 & bVar34) != 0) {
          bVar34 = (byte)uVar22 & bVar34;
        }
        uVar82 = 0;
        for (uVar36 = (uint)bVar34; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
          uVar82 = uVar82 + 1;
        }
        local_2590 = local_25a8->scene;
        do {
          auVar43 = auVar68._0_16_;
          uVar36 = uVar82 & 0xff;
          h.geomID = *(uint *)(lVar30 + 0x90 + (ulong)uVar36 * 4);
          pGVar11 = (local_2590->geometries).items[h.geomID].ptr;
          local_25f0 = (byte)uVar35;
          if ((pGVar11->mask & uVar81) == 0) {
            local_25f0 = ~(byte)(1 << (uVar82 & 0x1f)) & local_25f0;
          }
          else {
            pRVar12 = local_25a8->args;
            local_2458 = auVar94._0_32_;
            local_2438 = auVar93._0_32_;
            local_2418 = auVar92._0_32_;
            local_23f8 = auVar91._0_32_;
            local_23d8 = auVar89._0_32_;
            local_23b8 = auVar88._0_32_;
            local_2398 = auVar87._0_32_;
            if (pRVar12->filter == (RTCFilterFunctionN)0x0) {
              args.context = local_25a8->user;
              if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar39 = (ulong)(uVar36 << 2);
                fVar65 = *(float *)((long)local_24b8 + uVar39);
                fVar72 = *(float *)((long)local_24a8 + uVar39);
                (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar39);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar39);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar39);
                (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar39);
                ray->u = fVar65;
                ray->v = fVar72;
                ray->primID = *(uint *)(lVar30 + 0xa0 + uVar39);
                ray->geomID = h.geomID;
                ray->instID[0] = (args.context)->instID[0];
                ray->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = local_25a8->user;
            }
            uVar39 = (ulong)(uVar36 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_2488 + uVar39);
            h.Ng.field_0.field_0.y = *(float *)(local_2478 + uVar39);
            h.Ng.field_0.field_0.z = *(float *)(local_2468 + uVar39);
            h.u = *(float *)((long)local_24b8 + uVar39);
            h.v = *(float *)((long)local_24a8 + uVar39);
            h.primID = *(uint *)(lVar30 + 0xa0 + uVar39);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar39);
            local_25bc = -1;
            args.valid = &local_25bc;
            args.geometryUserPtr = pGVar11->userPtr;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            if (((pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                ((*pGVar11->intersectionFilterN)(&args), *args.valid != 0)) &&
               ((pRVar12->filter == (RTCFilterFunctionN)0x0 ||
                ((((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                   RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                 ((*pRVar12->filter)(&args), *args.valid != 0)))))) {
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              local_2528 = auVar79._0_4_;
              (ray->super_RayK<1>).tfar = local_2528;
            }
            auVar4._0_4_ = (ray->super_RayK<1>).tfar;
            auVar4._4_4_ = (ray->super_RayK<1>).mask;
            auVar4._8_4_ = (ray->super_RayK<1>).id;
            auVar4._12_4_ = (ray->super_RayK<1>).flags;
            auVar79 = ZEXT1664(auVar4);
            auVar68 = ZEXT1664(auVar43);
            fVar65 = (ray->super_RayK<1>).tfar;
            auVar27._4_4_ = fVar65;
            auVar27._0_4_ = fVar65;
            auVar27._8_4_ = fVar65;
            auVar27._12_4_ = fVar65;
            uVar22 = vcmpps_avx512vl(auVar43,auVar27,2);
            local_25f0 = ~(byte)(1 << (uVar82 & 0x1f)) & local_25f0 & (byte)uVar22;
            uVar81 = vextractps_avx(auVar4,1);
            auVar87 = ZEXT3264(local_2398);
            auVar88 = ZEXT3264(local_23b8);
            auVar89 = ZEXT3264(local_23d8);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar90 = ZEXT3264(auVar54);
            auVar91 = ZEXT3264(local_23f8);
            auVar92 = ZEXT3264(local_2418);
            auVar93 = ZEXT3264(local_2438);
            auVar94 = ZEXT3264(local_2458);
            auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar95 = ZEXT3264(auVar54);
            auVar54 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar96 = ZEXT3264(auVar54);
            auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar97 = ZEXT1664(auVar43);
            auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar98 = ZEXT3264(auVar54);
            auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
            auVar99 = ZEXT3264(auVar54);
          }
          uVar35 = (uint)local_25f0;
          if (local_25f0 == 0) break;
          auVar67._8_4_ = 0x7f800000;
          auVar67._0_8_ = 0x7f8000007f800000;
          auVar67._12_4_ = 0x7f800000;
          auVar43 = vblendmps_avx512vl(auVar67,auVar68._0_16_);
          auVar53._0_4_ =
               (uint)(local_25f0 & 1) * auVar43._0_4_ | (uint)!(bool)(local_25f0 & 1) * 0x7f800000;
          bVar38 = (bool)(local_25f0 >> 1 & 1);
          auVar53._4_4_ = (uint)bVar38 * auVar43._4_4_ | (uint)!bVar38 * 0x7f800000;
          bVar38 = (bool)(local_25f0 >> 2 & 1);
          auVar53._8_4_ = (uint)bVar38 * auVar43._8_4_ | (uint)!bVar38 * 0x7f800000;
          bVar38 = (bool)(local_25f0 >> 3 & 1);
          auVar53._12_4_ = (uint)bVar38 * auVar43._12_4_ | (uint)!bVar38 * 0x7f800000;
          auVar43 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar43 = vminps_avx(auVar43,auVar53);
          auVar77 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar77,auVar43);
          uVar22 = vcmpps_avx512vl(auVar53,auVar43,0);
          local_25f0 = (byte)uVar22 & local_25f0;
          uVar36 = uVar35;
          if (local_25f0 != 0) {
            uVar36 = (uint)local_25f0;
          }
          uVar82 = 0;
          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
            uVar82 = uVar82 + 1;
          }
        } while( true );
      }
    }
  }
  fVar65 = (ray->super_RayK<1>).tfar;
  auVar68 = ZEXT3264(CONCAT428(fVar65,CONCAT424(fVar65,CONCAT420(fVar65,CONCAT416(fVar65,CONCAT412(
                                                  fVar65,CONCAT48(fVar65,CONCAT44(fVar65,fVar65)))))
                                               )));
  goto LAB_01c7657a;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }